

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearSystem.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::LinearSystem::dynamicsControlFirstDerivative
          (LinearSystem *this,VectorDynSize *param_1,double time,MatrixDynSize *dynamicsDerivative)

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t sVar3;
  size_t sVar4;
  ostream *poVar5;
  bool isValid;
  ostringstream errorMsg;
  char local_1c1;
  double local_1c0;
  char *local_1b8 [4];
  ostringstream local_198 [376];
  
  local_1c1 = '\0';
  peVar1 = (this->m_pimpl->controlMatrix).
           super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_1c0 = time;
  iVar2 = (*peVar1->_vptr_TimeVaryingObject[2])(peVar1,&local_1c1);
  if (local_1c1 == '\0') {
    std::__cxx11::ostringstream::ostringstream(local_198);
    std::operator<<((ostream *)local_198,"Unable to retrieve a valid control matrix at time: ");
    poVar5 = std::ostream::_M_insert<double>(local_1c0);
    std::operator<<(poVar5,".");
    std::__cxx11::stringbuf::str();
    iDynTree::reportError("LinearSystem","dynamicsControlFirstDerivative",local_1b8[0]);
  }
  else {
    sVar3 = iDynTree::MatrixDynSize::rows();
    sVar4 = DynamicalSystem::stateSpaceSize(&this->super_DynamicalSystem);
    if (sVar3 == sVar4) {
      sVar3 = iDynTree::MatrixDynSize::cols();
      sVar4 = DynamicalSystem::controlSpaceSize(&this->super_DynamicalSystem);
      if (sVar3 == sVar4) {
        iDynTree::MatrixDynSize::operator=
                  (dynamicsDerivative,(MatrixDynSize *)CONCAT44(extraout_var,iVar2));
        return true;
      }
    }
    std::__cxx11::ostringstream::ostringstream(local_198);
    std::operator<<((ostream *)local_198,"The control matrix at time: ");
    poVar5 = std::ostream::_M_insert<double>(local_1c0);
    std::operator<<(poVar5,
                    " has dimensions not matching with the specified state/control space dimension."
                   );
    std::__cxx11::stringbuf::str();
    iDynTree::reportError("LinearSystem","dynamicsControlFirstDerivative",local_1b8[0]);
  }
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return false;
}

Assistant:

bool LinearSystem::dynamicsControlFirstDerivative(const VectorDynSize& /*state*/,
                                                    double time,
                                                    MatrixDynSize& dynamicsDerivative)
        {
            bool isValid = false;
            const MatrixDynSize& controlMatrix = m_pimpl->controlMatrix->get(time, isValid);

            if (!isValid) {
                std::ostringstream errorMsg;
                errorMsg << "Unable to retrieve a valid control matrix at time: " << time << ".";
                reportError("LinearSystem", "dynamicsControlFirstDerivative", errorMsg.str().c_str());
                return false;
            }

            if ((controlMatrix.rows() != stateSpaceSize()) || (controlMatrix.cols() != controlSpaceSize())) {
                std::ostringstream errorMsg;
                errorMsg << "The control matrix at time: " << time << " has dimensions not matching with the specified state/control space dimension.";
                reportError("LinearSystem", "dynamicsControlFirstDerivative", errorMsg.str().c_str());
                return false;
            }

            dynamicsDerivative = controlMatrix;
            return true;
        }